

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O3

RK_S32 mpi_dec_opt_o(void *ctx,char *next)

{
  if (next == (char *)0x0) {
    _mpp_log_l(4,"mpi_dec_utils","output file is invalid\n",0);
  }
  else {
    strncpy((char *)((long)ctx + 0x100),next,0xff);
    *(undefined4 *)((long)ctx + 0x214) = 1;
  }
  return (uint)(next != (char *)0x0);
}

Assistant:

RK_S32 mpi_dec_opt_o(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        strncpy(cmd->file_output, next, MAX_FILE_NAME_LENGTH - 1);
        cmd->have_output = 1;
        return 1;
    }

    mpp_log("output file is invalid\n");
    return 0;
}